

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int readMPS_LP_dense_cpp
              (char *filename,int mxNumRow,int mxNumCol,int *numRow_p,int *numCol_p,int *objSense_p,
              double *objOffset_p,double **A_rw_p,double **rhs_p,double **cost_p,double **lb_p,
              double **ub_p)

{
  int iVar1;
  int rtCd;
  int *integerColumn;
  int *in_stack_00000090;
  int *in_stack_00000098;
  double *in_stack_000000d0;
  double **in_stack_000000d8;
  double **in_stack_000000e0;
  double **in_stack_000000e8;
  double **in_stack_000000f0;
  double **in_stack_000000f8;
  int **in_stack_00000100;
  
  iVar1 = readMPS_dense_cpp((char *)rhs_p,A_rw_p._4_4_,(int)A_rw_p,(int *)objOffset_p,
                            in_stack_00000098,in_stack_00000090,in_stack_000000d0,in_stack_000000d8,
                            in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,in_stack_000000f8,
                            in_stack_00000100);
  return iVar1;
}

Assistant:

int readMPS_LP_dense_cpp(const char *filename, int mxNumRow, int mxNumCol, 
			 int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
			 double ** A_rw_p,
			 double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p) {
  
  int *integerColumn;
  int rtCd = readMPS_dense_cpp(filename, mxNumRow, mxNumCol,
			       numRow_p, numCol_p, objSense_p, objOffset_p,
			       A_rw_p,
			       rhs_p, cost_p, lb_p, ub_p,
			       &integerColumn);
  return rtCd;
}